

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default.cpp
# Opt level: O3

void fill_stack(string *filename,int data,char delimeter)

{
  int iVar1;
  _Alloc_hider __nptr;
  char cVar2;
  int iVar3;
  istream *piVar4;
  mapped_type *pmVar5;
  int *piVar6;
  long lVar7;
  undefined8 uVar8;
  int (*paiVar9) [8];
  long lVar10;
  long lVar11;
  bool bVar12;
  string word;
  string line;
  stringstream str;
  ifstream file;
  pointer local_410;
  int local_404;
  key_type local_400;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined1 local_3d0 [16];
  stringstream local_3c0 [128];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_404 = data;
  std::ifstream::ifstream((istream *)local_238,(string *)filename,_S_in);
  local_3e0 = local_3d0;
  local_3d8 = 0;
  local_3d0[0] = 0;
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  iVar1 = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3e0,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p);
      }
      if (local_3e0 != local_3d0) {
        operator_delete(local_3e0);
      }
      std::ifstream::~ifstream(local_238);
      return;
    }
    std::__cxx11::stringstream::stringstream(local_3c0,(string *)&local_3e0,_S_out|_S_in);
    lVar11 = -4;
    lVar10 = 0;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3c0,(string *)&local_400,delimeter);
      __nptr._M_p = local_400._M_dataplus._M_p;
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      bVar12 = lVar10 != 0;
      lVar10 = lVar10 + -1;
      if (bVar12) {
        piVar6 = __errno_location();
        if (local_404 == 0) {
          iVar3 = *piVar6;
          *piVar6 = 0;
          lVar7 = strtol(__nptr._M_p,&local_410,10);
          if (local_410 == __nptr._M_p) goto LAB_0013e61e;
          if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar6 != 0x22)) {
            if (*piVar6 == 0) {
              *piVar6 = iVar3;
            }
            paiVar9 = stack37;
            goto LAB_0013e575;
          }
        }
        else {
          iVar3 = *piVar6;
          *piVar6 = 0;
          lVar7 = strtol(__nptr._M_p,&local_410,10);
          if (local_410 != __nptr._M_p) {
            if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar6 != 0x22)) {
              if (*piVar6 == 0) {
                *piVar6 = iVar3;
              }
              paiVar9 = stackdH;
LAB_0013e575:
              *(int *)((long)paiVar9[iVar1] + lVar11) = (int)lVar7;
              goto LAB_0013e589;
            }
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
        }
        std::__throw_out_of_range("stoi");
LAB_0013e61e:
        uVar8 = std::__throw_invalid_argument("stoi");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != &local_400.field_2) {
          operator_delete(local_400._M_dataplus._M_p);
        }
        if (local_3e0 != local_3d0) {
          operator_delete(local_3e0);
        }
        std::ifstream::~ifstream(local_238);
        _Unwind_Resume(uVar8);
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_400);
      if (iVar3 == 0) break;
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pair2pos_abi_cxx11_,&local_400);
      iVar1 = *pmVar5;
LAB_0013e589:
      lVar11 = lVar11 + 4;
    }
    std::__cxx11::stringstream::~stringstream(local_3c0);
    std::ios_base::~ios_base(local_340);
  } while( true );
}

Assistant:

void fill_stack(const string &filename, int data, char delimeter) {
    ifstream file(filename);

//    cout << data << endl;

    string line, word;
    int idx = 0, cidx = 0;

    while (getline(file, line)) {
        stringstream str(line);
        idx = 0;
        while(getline(str, word, delimeter)) {
            if (idx == 0 && word == "Pairs") break;
            if (idx == 0) {
                cidx = pair2pos[word];
            } else {
                if (!data) {
//                    cout << idx << " " << word << endl;
                    stack37[cidx][idx-1] = stoi(word);
                } else {
                    stackdH[cidx][idx-1] = stoi(word);
                }

            }
            idx += 1;
        }

    }
}